

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int smem_open(char *filename,int rwmode,int *driverhandle)

{
  int iVar1;
  int *piVar2;
  DAL_SHM_SEGHEAD *sp;
  int r;
  int nitems;
  int h;
  int *driverhandle_local;
  char *pcStack_18;
  int rwmode_local;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._4_4_ = 0x98;
  }
  else if (driverhandle == (int *)0x0) {
    filename_local._4_4_ = 0x98;
  }
  else {
    _nitems = driverhandle;
    driverhandle_local._4_4_ = rwmode;
    pcStack_18 = filename;
    iVar1 = __isoc99_sscanf(filename,"h%d",&r);
    if (iVar1 == 1) {
      filename_local._4_4_ = shared_attach(r);
      if (filename_local._4_4_ == 0) {
        piVar2 = (int *)shared_lock(r,(uint)(driverhandle_local._4_4_ == 1));
        if (piVar2 == (int *)0x0) {
          shared_free(r);
          filename_local._4_4_ = 0x97;
        }
        else if ((r == piVar2[1]) && (*piVar2 == 0x19630114)) {
          *_nitems = r;
          filename_local._4_4_ = 0;
        }
        else {
          shared_unlock(r);
          shared_free(r);
          filename_local._4_4_ = 0x97;
        }
      }
    }
    else {
      filename_local._4_4_ = 0x97;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int     smem_open(char *filename, int rwmode, int *driverhandle)
 { int h, nitems, r;
   DAL_SHM_SEGHEAD *sp;


   if (NULL == filename) return(SHARED_NULPTR);
   if (NULL == driverhandle) return(SHARED_NULPTR);
   nitems = sscanf(filename, "h%d", &h);
   if (1 != nitems) return(SHARED_BADARG);

   if (SHARED_OK != (r = shared_attach(h))) return(r);

   if (NULL == (sp = (DAL_SHM_SEGHEAD *)shared_lock(h,
                ((READWRITE == rwmode) ? SHARED_RDWRITE : SHARED_RDONLY))))
     {  shared_free(h);
        return(SHARED_BADARG);
     }

   if ((h != sp->h) || (DAL_SHM_SEGHEAD_ID != sp->ID))
     { shared_unlock(h);
       shared_free(h);

       return(SHARED_BADARG);
     }

   *driverhandle = h;
   return(0);
 }